

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenaViolation.c
# Opt level: O0

int collectWithinWindowSignalWithDSC(Abc_Ntk_t *pNtk,Aig_Man_t *pAig)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  char *pcVar2;
  Aig_Obj_t *pObj;
  int i;
  Aig_Man_t *pAig_local;
  Abc_Ntk_t *pNtk_local;
  
  pObj._4_4_ = 0;
  while( true ) {
    iVar1 = Saig_ManPoNum(pAig);
    if (iVar1 <= pObj._4_4_) {
      return -1;
    }
    Vec_PtrEntry(pAig->vCos,pObj._4_4_);
    pObj_00 = Abc_NtkPo(pNtk,pObj._4_4_);
    pcVar2 = Abc_ObjName(pObj_00);
    pcVar2 = strstr(pcVar2,"withinWindow_");
    if (pcVar2 != (char *)0x0) break;
    pObj._4_4_ = pObj._4_4_ + 1;
  }
  return pObj._4_4_;
}

Assistant:

int collectWithinWindowSignalWithDSC( Abc_Ntk_t *pNtk, Aig_Man_t *pAig )
{
    int i;
    Aig_Obj_t *pObj;

    Saig_ManForEachPo( pAig, pObj, i )
    {
        if( strstr( Abc_ObjName(Abc_NtkPo( pNtk, i )), "withinWindow_" ) != NULL )
            return i;            
    }
    
    return -1;
}